

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbitblb.cpp
# Opt level: O3

void __thiscall icu_63::RBBITableBuilder::bofFixup(RBBITableBuilder *this)

{
  RBBINode *pRVar1;
  UVector *this_00;
  int *piVar2;
  int index;
  
  if (*this->fStatus < U_ILLEGAL_ARGUMENT_ERROR) {
    pRVar1 = (*this->fTree)->fLeftChild;
    this_00 = pRVar1->fRightChild->fFirstPosSet;
    if (0 < this_00->count) {
      pRVar1 = pRVar1->fLeftChild;
      index = 0;
      do {
        piVar2 = (int *)UVector::elementAt(this_00,index);
        if ((*piVar2 == 3) && (piVar2[0x1f] == pRVar1->fVal)) {
          setAdd(this,pRVar1->fFollowPos,*(UVector **)(piVar2 + 0x26));
        }
        index = index + 1;
      } while (index < this_00->count);
    }
  }
  return;
}

Assistant:

void RBBITableBuilder::bofFixup() {

    if (U_FAILURE(*fStatus)) {
        return;
    }

    //   The parse tree looks like this ...
    //         fTree root  --->       <cat>
    //                               /     \       .
    //                            <cat>   <#end node>
    //                           /     \  .
    //                     <bofNode>   rest
    //                               of tree
    //
    //    We will be adding things to the followPos set of the <bofNode>
    //
    RBBINode  *bofNode = fTree->fLeftChild->fLeftChild;
    U_ASSERT(bofNode->fType == RBBINode::leafChar);
    U_ASSERT(bofNode->fVal == 2);

    // Get all nodes that can be the start a match of the user-written rules
    //  (excluding the fake bofNode)
    //  We want the nodes that can start a match in the
    //     part labeled "rest of tree"
    // 
    UVector *matchStartNodes = fTree->fLeftChild->fRightChild->fFirstPosSet;

    RBBINode *startNode;
    int       startNodeIx;
    for (startNodeIx = 0; startNodeIx<matchStartNodes->size(); startNodeIx++) {
        startNode = (RBBINode *)matchStartNodes->elementAt(startNodeIx);
        if (startNode->fType != RBBINode::leafChar) {
            continue;
        }

        if (startNode->fVal == bofNode->fVal) {
            //  We found a leaf node corresponding to a {bof} that was
            //    explicitly written into a rule.
            //  Add everything from the followPos set of this node to the
            //    followPos set of the fake bofNode at the start of the tree.
            //  
            setAdd(bofNode->fFollowPos, startNode->fFollowPos);
        }
    }
}